

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,RandSequenceStatementSyntax *syntax)

{
  Compilation *compilation;
  pointer ppPVar1;
  size_type sVar2;
  ProductionSyntax *syntax_00;
  SourceLocation defaultLoc;
  StatementBlockSymbol *pSVar3;
  RandSeqProductionSymbol *symbol;
  long lVar4;
  Scope *this;
  string_view sVar5;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffffb0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_48;
  
  defaultLoc = parsing::Token::location(&syntax->randsequence);
  getLabel(&local_48,&syntax->super_StatementSyntax,defaultLoc);
  pSVar3 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)local_48.first._M_len,
                       (string_view)local_48._8_16_,(SourceLocation)0x0,Sequential,
                       (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffb0);
  compilation = scope->compilation;
  ppPVar1 = (syntax->productions).
            super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.data_;
  sVar2 = (syntax->productions).
          super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.size_;
  this = &pSVar3->super_Scope;
  for (lVar4 = 0; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    syntax_00 = *(ProductionSyntax **)((long)ppPVar1 + lVar4);
    sVar5 = parsing::Token::valueText(&syntax_00->name);
    if (sVar5._M_len != 0) {
      symbol = RandSeqProductionSymbol::fromSyntax(compilation,syntax_00);
      Scope::addMember(this,&symbol->super_Symbol);
    }
  }
  return pSVar3;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const RandSequenceStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.randsequence.location());
    auto result = createBlock(scope, syntax, name, loc, StatementBlockKind::Sequential,
                              VariableLifetime::Automatic);

    auto& comp = scope.getCompilation();
    for (auto prod : syntax.productions) {
        if (prod->name.valueText().empty())
            continue;

        auto& symbol = RandSeqProductionSymbol::fromSyntax(comp, *prod);
        result->addMember(symbol);
    }

    return *result;
}